

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void SetTexture(side_t *side,int position,char *name,FMissingTextureTracker *track)

{
  TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this;
  bool bVar1;
  FMissingCount *pFVar2;
  int iVar3;
  int local_4c;
  uint local_48;
  int j;
  int i;
  FString local_38;
  FTextureID local_2c;
  FMissingTextureTracker *pFStack_28;
  FTextureID texture;
  FMissingTextureTracker *track_local;
  char *name_local;
  int position_local;
  side_t *side_local;
  
  pFStack_28 = track;
  local_2c = FTextureManager::CheckForTexture(&TexMan,name,1,3);
  bVar1 = FTextureID::Exists(&local_2c);
  this = pFStack_28;
  if (!bVar1) {
    FString::FString(&local_38,name);
    pFVar2 = TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::
             operator[](this,&local_38);
    iVar3 = pFVar2->Count + 1;
    pFVar2->Count = iVar3;
    FString::~FString(&local_38);
    if (iVar3 < 0x15) {
      for (local_48 = 0; (int)local_48 < numlines; local_48 = local_48 + 1) {
        for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
          if (lines[(int)local_48].sidedef[local_4c] == side) {
            Printf("\x1cGUnknown %s texture \'\x1cI%s\x1cG\' on %s side of linedef %d\n",
                   SetTexture::positionnames[position],name,SetTexture::sidenames[local_4c],
                   (ulong)local_48);
          }
        }
      }
    }
    local_2c = FTextureManager::GetDefaultTexture(&TexMan);
  }
  side_t::SetTexture(side,position,local_2c);
  return;
}

Assistant:

static void SetTexture (side_t *side, int position, const char *name, FMissingTextureTracker &track)
{
	static const char *positionnames[] = { "top", "middle", "bottom" };
	static const char *sidenames[] = { "first", "second" };

	FTextureID texture = TexMan.CheckForTexture (name, FTexture::TEX_Wall,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);

	if (!texture.Exists())
	{
		if (++track[name].Count <= MISSING_TEXTURE_WARN_LIMIT)
		{
			// Print an error that lists all references to this sidedef.
			// We must scan the linedefs manually for all references to this sidedef.
			for(int i = 0; i < numlines; i++)
			{
				for(int j = 0; j < 2; j++)
				{
					if (lines[i].sidedef[j] == side)
					{
						Printf(TEXTCOLOR_RED"Unknown %s texture '"
							TEXTCOLOR_ORANGE "%s" TEXTCOLOR_RED
							"' on %s side of linedef %d\n",
							positionnames[position], name, sidenames[j], i);
					}
				}
			}
		}
		texture = TexMan.GetDefaultTexture();
	}
	side->SetTexture(position, texture);
}